

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cc
# Opt level: O2

void brotli::CreateBackwardReferences<brotli::HashLongestMatch<15,6,10>>
               (size_t num_bytes,size_t position,bool is_last,uint8_t *ringbuffer,
               size_t ringbuffer_mask,int quality,int lgwin,HashLongestMatch<15,_6,_10> *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  long lVar1;
  bool bVar2;
  ulong uVar3;
  size_t sVar4;
  uint32_t uVar5;
  size_t sVar6;
  long lVar7;
  uint8_t *data;
  ulong uVar8;
  ulong uVar9;
  size_t insertlen;
  ulong uVar10;
  long lVar11;
  size_t best_len;
  ulong local_e8;
  size_t local_e0;
  size_t best_dist;
  long local_d0;
  Command *local_c8;
  double best_score;
  size_t best_len_code;
  long local_b0;
  uint8_t *local_a8;
  double best_score_2;
  size_t best_dist_2;
  size_t best_len_code_2;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  long local_70;
  uint8_t *local_68;
  long local_60;
  ulong local_58;
  long local_50;
  Command cmd;
  
  local_e0 = ringbuffer_mask;
  if ((num_bytes < 0x201 && is_last) && position == 0) {
    HashLongestMatch<15,_6,_10>::InitForData(hasher,ringbuffer,num_bytes);
  }
  else {
    if (hasher->need_init_ == true) {
      memset(hasher,0,0x10000);
      hasher->need_init_ = false;
    }
    sVar6 = local_e0;
    if (2 < position && 2 < num_bytes) {
      HashLongestMatch<15,_6,_10>::Store
                (hasher,ringbuffer + (position - 3 & local_e0),(uint32_t)(position - 3));
      HashLongestMatch<15,_6,_10>::Store
                (hasher,ringbuffer + (position - 2 & sVar6),(uint32_t)(position - 2));
      HashLongestMatch<15,_6,_10>::Store
                (hasher,ringbuffer + (position - 1 & sVar6),(uint32_t)(position - 1));
    }
  }
  uVar9 = (ulong)((1 << ((byte)lgwin & 0x1f)) + -0x10);
  sVar6 = *last_insert_len;
  uVar10 = local_e0 & position;
  local_b0 = position - uVar10;
  local_58 = uVar10 + num_bytes;
  local_60 = 0x200;
  if (quality < 9) {
    local_60 = 0x40;
  }
  local_e8 = local_60 + uVar10;
  local_78 = (ulong)(uint)((int)local_60 * 4);
  local_80 = (uVar10 - 3) + num_bytes;
  local_88 = (uVar10 - 4) + num_bytes;
  local_d0 = local_b0 + 1;
  local_50 = (uVar10 - 1) + num_bytes;
  local_68 = ringbuffer + 2;
  local_70 = local_b0 + 2;
  local_c8 = commands;
  local_a8 = ringbuffer;
  do {
    while( true ) {
      uVar8 = uVar10;
      if (local_58 <= uVar8 + 3) {
        *last_insert_len = (local_58 - uVar8) + sVar6;
        *num_commands = *num_commands + ((long)local_c8 - (long)commands) / 0x18;
        return;
      }
      uVar10 = uVar8 + local_b0;
      uVar3 = uVar9;
      if (uVar10 < uVar9) {
        uVar3 = uVar10;
      }
      best_len = 0;
      best_len_code = 0;
      best_dist = 0;
      best_score = 4.0;
      bVar2 = HashLongestMatch<15,_6,_10>::FindLongestMatch
                        (hasher,ringbuffer,local_e0,dist_cache,uVar10 & 0xffffffff,local_58 - uVar8,
                         uVar3,&best_len,&best_len_code,&best_dist,&best_score);
      if (bVar2) break;
      sVar6 = sVar6 + 1;
      uVar10 = uVar8 + 1;
      if (local_e8 < uVar10) {
        if (local_78 + local_e8 < uVar10) {
          uVar3 = uVar8 + 0x11;
          if (local_88 < uVar8 + 0x11) {
            uVar3 = local_88;
          }
          uVar5 = (int)uVar8 + (int)local_d0;
          for (; uVar10 < uVar3; uVar10 = uVar10 + 4) {
            HashLongestMatch<15,_6,_10>::Store(hasher,ringbuffer + uVar10,uVar5);
            sVar6 = sVar6 + 4;
            uVar5 = uVar5 + 4;
          }
        }
        else {
          uVar3 = uVar8 + 9;
          if (local_80 < uVar8 + 9) {
            uVar3 = local_80;
          }
          uVar5 = (int)uVar8 + (int)local_d0;
          for (; uVar10 < uVar3; uVar10 = uVar10 + 2) {
            HashLongestMatch<15,_6,_10>::Store(hasher,ringbuffer + uVar10,uVar5);
            sVar6 = sVar6 + 2;
            uVar5 = uVar5 + 2;
          }
        }
      }
    }
    local_e8 = sVar6 + 4;
    lVar1 = local_d0 + uVar8;
    lVar11 = -uVar8;
    lVar7 = 0;
    sVar4 = best_len;
    do {
      best_len = sVar4;
      uVar10 = local_50 + lVar11;
      cmd._0_8_ = best_len - 1;
      if (uVar10 < best_len - 1) {
        cmd._0_8_ = uVar10;
      }
      if (4 < quality) {
        cmd._0_8_ = 0;
      }
      best_len_code_2 = 0;
      best_dist_2 = 0;
      best_score_2 = 4.0;
      uVar3 = lVar1 + lVar7;
      uVar8 = uVar9;
      if (uVar3 < uVar9) {
        uVar8 = uVar3;
      }
      bVar2 = HashLongestMatch<15,_6,_10>::FindLongestMatch
                        (hasher,local_a8,local_e0,dist_cache,uVar3 & 0xffffffff,uVar10,uVar8,
                         (size_t *)&cmd,&best_len_code_2,&best_dist_2,&best_score_2);
      if ((!bVar2) || (best_score_2 < best_score + 7.0)) {
        insertlen = sVar6 + lVar7;
        break;
      }
      sVar4._0_4_ = cmd.insert_len_;
      sVar4._4_4_ = cmd.copy_len_;
      best_len._0_4_ = cmd.insert_len_;
      best_len._4_4_ = cmd.copy_len_;
      best_len_code = best_len_code_2;
      best_dist = best_dist_2;
      best_score = best_score_2;
      lVar11 = lVar11 + -1;
      lVar7 = lVar7 + 1;
      insertlen = local_e8;
    } while ((int)lVar7 != 4);
    sVar6 = best_len;
    lVar11 = -lVar11;
    uVar10 = lVar11 + local_b0;
    if (uVar9 <= (ulong)(lVar11 + local_b0)) {
      uVar10 = uVar9;
    }
    sVar4 = ComputeDistanceCode(best_dist,uVar10,quality,dist_cache);
    if (sVar4 != 0 && best_dist <= uVar10) {
      dist_cache[3] = dist_cache[2];
      *(undefined8 *)(dist_cache + 1) = *(undefined8 *)dist_cache;
      *dist_cache = (int)best_dist;
    }
    local_e8 = local_60 + lVar11 + sVar6 * 2;
    Command::Command(&cmd,insertlen,best_len,best_len_code,sVar4);
    local_c8->dist_extra_ = cmd.dist_extra_;
    local_c8->cmd_prefix_ = cmd.cmd_prefix_;
    local_c8->dist_prefix_ = cmd.dist_prefix_;
    local_c8->insert_len_ = cmd.insert_len_;
    local_c8->copy_len_ = cmd.copy_len_;
    local_c8->cmd_extra_ = cmd.cmd_extra_;
    *num_literals = *num_literals + insertlen;
    data = local_68 + lVar11;
    uVar5 = (int)local_70 + (int)lVar11;
    for (uVar10 = 2; uVar10 < best_len; uVar10 = uVar10 + 1) {
      HashLongestMatch<15,_6,_10>::Store(hasher,data,uVar5);
      data = data + 1;
      uVar5 = uVar5 + 1;
    }
    local_c8 = local_c8 + 1;
    sVar6 = 0;
    ringbuffer = local_a8;
    uVar10 = best_len + lVar11;
  } while( true );
}

Assistant:

void CreateBackwardReferences(size_t num_bytes,
                              size_t position,
                              bool is_last,
                              const uint8_t* ringbuffer,
                              size_t ringbuffer_mask,
                              const int quality,
                              const int lgwin,
                              Hasher* hasher,
                              int* dist_cache,
                              size_t* last_insert_len,
                              Command* commands,
                              size_t* num_commands,
                              size_t* num_literals) {
  // Set maximum distance, see section 9.1. of the spec.
  const size_t max_backward_limit = (1 << lgwin) - 16;

  // Choose which init method is faster.
  // memset is about 100 times faster than hasher->InitForData().
  const size_t kMaxBytesForPartialHashInit = Hasher::kHashMapSize >> 7;
  if (position == 0 && is_last && num_bytes <= kMaxBytesForPartialHashInit) {
    hasher->InitForData(ringbuffer, num_bytes);
  } else {
    hasher->Init();
  }
  if (num_bytes >= 3 && position >= 3) {
    // Prepare the hashes for three last bytes of the last write.
    // These could not be calculated before, since they require knowledge
    // of both the previous and the current block.
    hasher->Store(&ringbuffer[(position - 3) & ringbuffer_mask],
                  static_cast<uint32_t>(position - 3));
    hasher->Store(&ringbuffer[(position - 2) & ringbuffer_mask],
                  static_cast<uint32_t>(position - 2));
    hasher->Store(&ringbuffer[(position - 1) & ringbuffer_mask],
                  static_cast<uint32_t>(position - 1));
  }
  const Command * const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  size_t i = position & ringbuffer_mask;
  const size_t i_diff = position - i;
  const size_t i_end = i + num_bytes;

  // For speed up heuristics for random data.
  const size_t random_heuristics_window_size = quality < 9 ? 64 : 512;
  size_t apply_random_heuristics = i + random_heuristics_window_size;

  // Minimum score to accept a backward reference.
  const int kMinScore = 4.0;

  while (i + Hasher::kHashTypeLength - 1 < i_end) {
    size_t max_length = i_end - i;
    size_t max_distance = std::min(i + i_diff, max_backward_limit);
    size_t best_len = 0;
    size_t best_len_code = 0;
    size_t best_dist = 0;
    double best_score = kMinScore;
    bool match_found = hasher->FindLongestMatch(
        ringbuffer, ringbuffer_mask,
        dist_cache, static_cast<uint32_t>(i + i_diff), max_length, max_distance,
        &best_len, &best_len_code, &best_dist, &best_score);
    if (match_found) {
      // Found a match. Let's look for something even better ahead.
      int delayed_backward_references_in_row = 0;
      for (;;) {
        --max_length;
        size_t best_len_2 =
            quality < 5 ? std::min(best_len - 1, max_length) : 0;
        size_t best_len_code_2 = 0;
        size_t best_dist_2 = 0;
        double best_score_2 = kMinScore;
        max_distance = std::min(i + i_diff + 1, max_backward_limit);
        match_found = hasher->FindLongestMatch(
            ringbuffer, ringbuffer_mask,
            dist_cache, static_cast<uint32_t>(i + i_diff + 1),
            max_length, max_distance,
            &best_len_2, &best_len_code_2, &best_dist_2, &best_score_2);
        double cost_diff_lazy = 7.0;
        if (match_found && best_score_2 >= best_score + cost_diff_lazy) {
          // Ok, let's just write one byte for now and start a match from the
            // next byte.
          ++i;
          ++insert_length;
          best_len = best_len_2;
          best_len_code = best_len_code_2;
          best_dist = best_dist_2;
          best_score = best_score_2;
          if (++delayed_backward_references_in_row < 4) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          i + 2 * best_len + random_heuristics_window_size;
      max_distance = std::min(i + i_diff, max_backward_limit);
      // The first 16 codes are special shortcodes, and the minimum offset is 1.
      size_t distance_code =
          ComputeDistanceCode(best_dist, max_distance, quality, dist_cache);
      if (best_dist <= max_distance && distance_code > 0) {
        dist_cache[3] = dist_cache[2];
        dist_cache[2] = dist_cache[1];
        dist_cache[1] = dist_cache[0];
        dist_cache[0] = static_cast<int>(best_dist);
      }
      Command cmd(insert_length, best_len, best_len_code, distance_code);
      *commands++ = cmd;
      *num_literals += insert_length;
      insert_length = 0;
      // Put the hash keys into the table, if there are enough
      // bytes left.
      for (size_t j = 2; j < best_len; ++j) {
        hasher->Store(&ringbuffer[i + j],
                      static_cast<uint32_t>(i + i_diff + j));
      }
      i += best_len;
    } else {
      ++insert_length;
      ++i;
      // If we have not seen matches for a long time, we can skip some
      // match lookups. Unsuccessful match lookups are very very expensive
      // and this kind of a heuristic speeds up compression quite
      // a lot.
      if (i > apply_random_heuristics) {
        // Going through uncompressible data, jump.
        if (i > apply_random_heuristics + 4 * random_heuristics_window_size) {
          // It is quite a long time since we saw a copy, so we assume
          // that this data is not compressible, and store hashes less
          // often. Hashes of non compressible data are less likely to
          // turn out to be useful in the future, too, so we store less of
          // them to not to flood out the hash table of good compressible
          // data.
          size_t i_jump = std::min(i + 16, i_end - 4);
          for (; i < i_jump; i += 4) {
            hasher->Store(ringbuffer + i, static_cast<uint32_t>(i + i_diff));
            insert_length += 4;
          }
        } else {
          size_t i_jump = std::min(i + 8, i_end - 3);
          for (; i < i_jump; i += 2) {
            hasher->Store(ringbuffer + i, static_cast<uint32_t>(i + i_diff));
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += i_end - i;
  *last_insert_len = insert_length;
  *num_commands += static_cast<size_t>(commands - orig_commands);
}